

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fretInit.c
# Opt level: O3

void Abc_FlowRetime_PrintInitStateInfo(Abc_Ntk_t *pNtk)

{
  void *pvVar1;
  long lVar2;
  long lVar3;
  ulong uVar4;
  ulong uVar5;
  uint uVar6;
  ulong uVar7;
  long lVar8;
  
  lVar3 = (long)pNtk->vBoxes->nSize;
  if (lVar3 < 1) {
    printf("\tinitial states {0,1,x} = {%d, %d, %d}",0,0,0);
  }
  else {
    lVar8 = 0;
    uVar6 = 0;
    uVar4 = 0;
    uVar5 = 0;
    uVar7 = 0;
    do {
      pvVar1 = pNtk->vBoxes->pArray[lVar8];
      if ((*(uint *)((long)pvVar1 + 0x14) & 0xf) == 8) {
        lVar2 = *(long *)((long)pvVar1 + 0x38);
        if (lVar2 == 3) {
          uVar4 = (ulong)((int)uVar4 + 1);
        }
        else if (lVar2 == 2) {
          uVar5 = (ulong)((int)uVar5 + 1);
        }
        else if (lVar2 == 1) {
          uVar7 = (ulong)((int)uVar7 + 1);
        }
        else {
          uVar6 = uVar6 + 1;
        }
      }
      lVar8 = lVar8 + 1;
    } while (lVar3 != lVar8);
    printf("\tinitial states {0,1,x} = {%d, %d, %d}",uVar7,uVar5,uVar4);
    if (uVar6 != 0) {
      printf(" + %d UNKNOWN",(ulong)uVar6);
    }
  }
  putchar(10);
  return;
}

Assistant:

void
Abc_FlowRetime_PrintInitStateInfo( Abc_Ntk_t * pNtk ) {
  int i, n0=0, n1=0, nDC=0, nOther=0;
  Abc_Obj_t *pLatch;

  Abc_NtkForEachLatch( pNtk, pLatch, i ) {
    if (Abc_LatchIsInit0(pLatch)) n0++;
    else if (Abc_LatchIsInit1(pLatch)) n1++;
    else if (Abc_LatchIsInitDc(pLatch)) nDC++;
    else nOther++;
  }     

  printf("\tinitial states {0,1,x} = {%d, %d, %d}", n0, n1, nDC);
  if (nOther)
    printf(" + %d UNKNOWN", nOther);
  printf("\n");
}